

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O3

void iDynTree::computeTransformToTraversalBaseWithAdditionalTransform
               (Model *fullModel,Traversal *subModelTraversal,JointPosDoubleArray *jointPos,
               LinkPositions *traversalBase_H_link,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
               *newLink_H_oldLink)

{
  _Hash_node_base this;
  uint uVar1;
  Link *this_00;
  Link *this_01;
  IJoint *pIVar2;
  LinkIndex LVar3;
  Transform *pTVar4;
  LinkIndex LVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_true>
  _Var6;
  ulong traversalIndex;
  _Hash_node_base this_02;
  _Hash_node_base local_b8;
  undefined1 local_b0 [32];
  string local_90 [3];
  
  local_b8._M_nxt = (_Hash_node_base *)traversalBase_H_link;
  local_b0._0_8_ = fullModel;
  local_b0._8_8_ = newLink_H_oldLink;
  local_b0._24_8_ = jointPos;
  uVar1 = Traversal::getNrOfVisitedLinks(subModelTraversal);
  this._M_nxt = local_b8._M_nxt;
  if (uVar1 != 0) {
    traversalIndex = 0;
    local_b0._16_8_ = subModelTraversal;
    do {
      this_00 = Traversal::getLink(subModelTraversal,traversalIndex);
      this_01 = Traversal::getParentLink(subModelTraversal,traversalIndex);
      pIVar2 = Traversal::getParentJoint(subModelTraversal,traversalIndex);
      if (this_01 == (Link *)0x0) {
        LVar3 = Link::getIndex(this_00);
        Model::getLinkName_abi_cxx11_((string *)(local_b0 + 0x20),(Model *)local_b0._0_8_,LVar3);
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)local_b0._8_8_,(string *)(local_b0 + 0x20));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90[0]._M_dataplus._M_p != &local_90[0].field_2) {
          operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1
                         );
        }
        if (_Var6._M_cur == (__node_type *)0x0) {
          iDynTree::Transform::Identity();
          LVar3 = Link::getIndex(this_00);
          this_02._M_nxt = local_b8._M_nxt;
          goto LAB_0015ade8;
        }
        LVar3 = Link::getIndex(this_00);
        pTVar4 = LinkPositions::operator()((LinkPositions *)local_b8._M_nxt,LVar3);
      }
      else {
        LVar3 = Link::getIndex(this_01);
        pTVar4 = LinkPositions::operator()((LinkPositions *)this._M_nxt,LVar3);
        LVar3 = Link::getIndex(this_01);
        LVar5 = Link::getIndex(this_00);
        (*pIVar2->_vptr_IJoint[10])(pIVar2,local_b0._24_8_,LVar3,LVar5);
        subModelTraversal = (Traversal *)local_b0._16_8_;
        iDynTree::Transform::operator*((Transform *)(local_b0 + 0x20),pTVar4);
        LVar3 = Link::getIndex(this_00);
        this_02._M_nxt = this._M_nxt;
LAB_0015ade8:
        pTVar4 = LinkPositions::operator()((LinkPositions *)this_02._M_nxt,LVar3);
        _Var6._M_cur = (__node_type *)&local_b8;
      }
      iDynTree::Transform::operator=
                (pTVar4,(Transform *)
                        (((_Var6._M_cur)->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>
                         ._M_storage._M_storage.__data + 0x20));
      traversalIndex = traversalIndex + 1;
      uVar1 = Traversal::getNrOfVisitedLinks(subModelTraversal);
    } while (traversalIndex < uVar1);
  }
  return;
}

Assistant:

void computeTransformToTraversalBaseWithAdditionalTransform(const Model& fullModel,
                                                            const Traversal& subModelTraversal,
                                                            const JointPosDoubleArray& jointPos,
                                                                  LinkPositions& traversalBase_H_link,
                                                            const std::unordered_map<std::string, iDynTree::Transform>& newLink_H_oldLink)
{
    for(unsigned int traversalEl=0; traversalEl < subModelTraversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
        LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = subModelTraversal.getParentJoint(traversalEl);

        // If this is the traversal base
        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the position of the base with respect to the base is simply
            // an identity transform, or a given transform if the link is in newLink_H_oldLink
            auto it = newLink_H_oldLink.find(fullModel.getLinkName(visitedLink->getIndex()));

            if (it != newLink_H_oldLink.end())
            {
                traversalBase_H_link(visitedLink->getIndex()) = it->second;
            }
            else
            {
                traversalBase_H_link(visitedLink->getIndex()) = iDynTree::Transform::Identity();
            }
        }
        else
        {
            // Otherwise we compute the world_H_link transform as:
            // world_H_link = world_H_parentLink * parentLink_H_link
            traversalBase_H_link(visitedLink->getIndex()) =
                traversalBase_H_link(parentLink->getIndex())*
                    toParentJoint->getTransform(jointPos,parentLink->getIndex(),visitedLink->getIndex());
        }
    }

    return;
}